

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O2

void __thiscall
avro::ReaderImpl<avro::NullValidator>::readValue(ReaderImpl<avro::NullValidator> *this,float *val)

{
  undefined7 in_register_00000001;
  anon_union_4_2_947300a4 v;
  float local_14;
  
  local_14 = (float)((uint7)in_register_00000001 >> 0x18);
  BufferReader::read<unsigned_int>((BufferReader *)(this + 8),(uint *)&local_14);
  *val = local_14;
  return;
}

Assistant:

void readValue(float &val) {
        validator_.checkTypeExpected(AVRO_FLOAT);
        union { 
            float f;
            uint32_t i;
        } v;
        reader_.read(v.i);
        val = v.f;
    }